

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.h
# Opt level: O0

Time bsplib::TicToc::timeDiff(Time a,Time b)

{
  Time TVar1;
  Time b_local;
  Time a_local;
  
  b_local.tv_nsec = a.tv_sec - b.tv_sec;
  a_local.tv_sec = a.tv_nsec - b.tv_nsec;
  if (a_local.tv_sec < 1000000000) {
    if (a_local.tv_sec < 0) {
      b_local.tv_nsec = b_local.tv_nsec + -1;
      a_local.tv_sec = a_local.tv_sec + 1000000000;
    }
  }
  else {
    b_local.tv_nsec = b_local.tv_nsec + 1;
    a_local.tv_sec = a_local.tv_sec + -1000000000;
  }
  TVar1.tv_nsec = a_local.tv_sec;
  TVar1.tv_sec = b_local.tv_nsec;
  return TVar1;
}

Assistant:

static Time timeDiff( Time a, Time b )
    { a.tv_sec -= b.tv_sec; 
      a.tv_nsec -= b.tv_nsec;
      if ( a.tv_nsec >= 1000000000l ) {
          a.tv_sec += 1;
          a.tv_nsec -= 1000000000l;
      } else if ( a.tv_nsec < 0) {
          a.tv_sec -= 1;
          a.tv_nsec += 1000000000l;
      }
      return a;
    }